

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::init
          (InterInvocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *__return_storage_ptr__;
  int iVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int extraout_EAX;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  ShaderProgram *this_02;
  ProgramSources *sources;
  TestLog *pTVar8;
  TestError *this_03;
  size_type sVar9;
  MessageBuilder *pMVar10;
  long lVar11;
  reference pvVar12;
  const_reference pvVar13;
  reference pvVar14;
  MessageBuilder local_828;
  allocator<int> local_6a5;
  value_type_conflict1 local_6a4;
  undefined1 local_6a0 [8];
  vector<int,_std::allocator<int>_> negativeBuffer;
  int bufferSize_2;
  int bufferElements_2;
  undefined1 local_678 [8];
  vector<int,_std::allocator<int>_> zeroBuffer_1;
  int local_4dc;
  MessageBuilder local_4d8;
  int local_358;
  int local_354;
  int bufferSize_1;
  int bufferElements_1;
  allocator<unsigned_int> local_1cd;
  value_type_conflict4 local_1cc;
  undefined1 local_1c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroBuffer;
  int local_1a8;
  int bufferSize;
  int bufferElements;
  undefined1 local_179;
  string local_178;
  ShaderSource local_158;
  ProgramSources local_130;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  deUint32 local_24;
  ContextType local_20;
  undefined1 local_19;
  long lStack_18;
  bool supportsES32;
  Functions *gl;
  InterInvocationTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar5);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_20.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::es(3,2);
  local_19 = glu::contextSupports(local_20,(ApiType)local_24);
  if ((((this->m_useAtomic & 1U) != 0) && (this->m_storage == STORAGE_IMAGE)) && (!(bool)local_19))
  {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar4 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_image_atomic");
    if (!bVar4) {
      local_5d = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Test requires GL_OES_shader_image_atomic extension",&local_49)
      ;
      tcu::NotSupportedError::NotSupportedError(this_01,&local_48);
      local_5d = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_02 = (ShaderProgram *)operator_new(0xd0);
  local_179 = 1;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_130);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_178);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_158,&local_178);
  sources = glu::ProgramSources::operator<<(&local_130,&local_158);
  glu::ShaderProgram::ShaderProgram(this_02,pRVar7,sources);
  local_179 = 0;
  this->m_program = this_02;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  glu::ProgramSources::~ProgramSources(&local_130);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar8,this->m_program);
  bVar4 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar4) {
    if (this->m_storage == STORAGE_BUFFER) {
      local_1a8 = this->m_workWidth * this->m_workHeight * this->m_elementsPerInvocation;
      zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = local_1a8 * 4;
      sVar9 = (size_type)local_1a8;
      local_1cc = 0;
      std::allocator<unsigned_int>::allocator(&local_1cd);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,sVar9,&local_1cc,
                 &local_1cd);
      std::allocator<unsigned_int>::~allocator(&local_1cd);
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&bufferSize_1,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&bufferSize_1,
                           (char (*) [49])"Allocating zero-filled buffer for storage, size ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1a8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])" elements, ");
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(int *)((long)&zeroBuffer.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4));
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2c60f60);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bufferSize_1);
      (**(code **)(lStack_18 + 0x6c8))(1,&this->m_storageBuf);
      (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_storageBuf);
      pcVar3 = *(code **)(lStack_18 + 0x150);
      lVar11 = (long)zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
      (*pcVar3)(0x90d2,lVar11,pvVar12,0x88e4);
      dVar6 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar6,"gen storage buf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0xea);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
    }
    else if (this->m_storage == STORAGE_IMAGE) {
      local_354 = this->m_workWidth * this->m_workHeight * this->m_elementsPerInvocation;
      local_358 = local_354 * 4;
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4d8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_4d8,(char (*) [36])"Allocating image for storage, size ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_workWidth);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2a8224a);
      local_4dc = this->m_workHeight * this->m_elementsPerInvocation;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_4dc);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_358);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2c60f60);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4d8);
      (**(code **)(lStack_18 + 0x6f8))(1,&this->m_storageTex);
      (**(code **)(lStack_18 + 0xb8))(0xde1,this->m_storageTex);
      (**(code **)(lStack_18 + 0x1380))
                (0xde1,1,0x8235,this->m_workWidth,this->m_workHeight * this->m_elementsPerInvocation
                );
      (**(code **)(lStack_18 + 0x1360))(0xde1,0x2801);
      (**(code **)(lStack_18 + 0x1360))(0xde1,0x2800,0x2600);
      dVar6 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar6,"gen storage image",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0xf8);
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      __return_storage_ptr__ =
           &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      tcu::TestLog::operator<<
                ((MessageBuilder *)__return_storage_ptr__,pTVar8,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)__return_storage_ptr__,
                           (char (*) [22])"Filling image with 0.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)
                 &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      iVar5 = this->m_workWidth;
      iVar1 = this->m_workHeight;
      iVar2 = this->m_elementsPerInvocation;
      bufferElements_2 = 0;
      std::allocator<int>::allocator((allocator<int> *)((long)&bufferSize_2 + 3));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_678,(long)(iVar5 * iVar1 * iVar2),
                 &bufferElements_2,(allocator<int> *)((long)&bufferSize_2 + 3));
      std::allocator<int>::~allocator((allocator<int> *)((long)&bufferSize_2 + 3));
      pcVar3 = *(code **)(lStack_18 + 0x13b8);
      iVar5 = this->m_workWidth;
      iVar1 = this->m_workHeight;
      iVar2 = this->m_elementsPerInvocation;
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_678,0);
      (*pcVar3)(0xde1,0,0,0,iVar5,iVar1 * iVar2,0x8d94,0x1404,pvVar13);
      dVar6 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar6,"specify image contents",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0x100);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_678);
    }
    negativeBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = this->m_workWidth * this->m_workHeight;
    negativeBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         negativeBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ * 4;
    sVar9 = (size_type)
            negativeBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    local_6a4 = -1;
    std::allocator<int>::allocator(&local_6a5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_6a0,sVar9,&local_6a4,&local_6a5);
    std::allocator<int>::~allocator(&local_6a5);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_828,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_828,(char (*) [47])"Allocating -1 filled buffer for results, size ")
    ;
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,(int *)((long)&negativeBuffer.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4));
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])" elements, ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,(int *)&negativeBuffer.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2c60f60);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_828);
    (**(code **)(lStack_18 + 0x6c8))(1,&this->m_resultBuf);
    (**(code **)(lStack_18 + 0x40))(0x90d2,this->m_resultBuf);
    pcVar3 = *(code **)(lStack_18 + 0x150);
    lVar11 = (long)(int)negativeBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_6a0,0);
    (*pcVar3)(0x90d2,lVar11,pvVar14,0x88e4);
    dVar6 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar6,"gen storage buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x112);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_6a0);
    return extraout_EAX;
  }
  bufferSize._2_1_ = 1;
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufferElements,"could not build program",
             (allocator<char> *)((long)&bufferSize + 3));
  tcu::TestError::TestError(this_03,(string *)&bufferElements);
  bufferSize._2_1_ = 0;
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InterInvocationTestCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// program

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genShaderSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	// source

	if (m_storage == STORAGE_BUFFER)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deUint32>	zeroBuffer		(bufferElements, 0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating zero-filled buffer for storage, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_storageBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_storageBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating image for storage, size " << m_workWidth << "x" << m_workHeight * m_elementsPerInvocation << ", " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genTextures(1, &m_storageTex);
		gl.bindTexture(GL_TEXTURE_2D, m_storageTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32I, m_workWidth, m_workHeight * m_elementsPerInvocation);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage image");

		// Zero-fill
		m_testCtx.getLog() << tcu::TestLog::Message << "Filling image with 0." << tcu::TestLog::EndMessage;

		{
			const std::vector<deInt32> zeroBuffer(m_workWidth * m_workHeight * m_elementsPerInvocation, 0);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, m_workWidth, m_workHeight * m_elementsPerInvocation, GL_RED_INTEGER, GL_INT, &zeroBuffer[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "specify image contents");
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	// destination

	{
		const int				bufferElements	= m_workWidth * m_workHeight;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deInt32>	negativeBuffer	(bufferElements, -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating -1 filled buffer for results, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_resultBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_resultBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &negativeBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
}